

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

ExpressionSyntax * parseExpression(string *text)

{
  SourceManager *this;
  ExpressionSyntax *pEVar1;
  Parser parser;
  Preprocessor preprocessor;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffff810;
  char *in_stack_fffffffffffff818;
  Bag *options;
  Preprocessor *preprocessor_00;
  Parser *this_00;
  Preprocessor *in_stack_fffffffffffff8b0;
  string_view in_stack_fffffffffffff8b8;
  string_view in_stack_fffffffffffff8c8;
  undefined8 uStack_3e0;
  Bag *in_stack_fffffffffffffd58;
  Diagnostics *in_stack_fffffffffffffd60;
  BumpAllocator *in_stack_fffffffffffffd68;
  SourceManager *in_stack_fffffffffffffd70;
  Preprocessor *in_stack_fffffffffffffd78;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffef0;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffff810);
  this = getSourceManager();
  slang::Bag::Bag((Bag *)0x19ea67);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x19ea74);
  slang::parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffef0);
  slang::Bag::~Bag((Bag *)0x19eab4);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_3e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_fffffffffffff818);
  slang::parsing::Preprocessor::pushSource
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8b8);
  preprocessor_00 = (Preprocessor *)0x0;
  this_00 = (Parser *)0x0;
  options = (Bag *)0x0;
  slang::Bag::Bag((Bag *)0x19eb30);
  slang::parsing::Parser::Parser(this_00,preprocessor_00,options);
  slang::Bag::~Bag((Bag *)0x19eb55);
  pEVar1 = slang::parsing::Parser::parseExpression((Parser *)uStack_3e0);
  slang::parsing::Parser::~Parser((Parser *)uStack_3e0);
  slang::parsing::Preprocessor::~Preprocessor(uStack_3e0);
  return pEVar1;
}

Assistant:

const ExpressionSyntax& parseExpression(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    return parser.parseExpression();
}